

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O2

int add(svm_params *params,svm_example *fec)

{
  svm_model *psVar1;
  float local_1c;
  svm_example *local_18;
  
  psVar1 = params->model;
  psVar1->num_support = psVar1->num_support + 1;
  local_18 = fec;
  v_array<svm_example_*>::push_back(&psVar1->support_vec,&local_18);
  local_1c = 0.0;
  v_array<float>::push_back(&psVar1->alpha,&local_1c);
  local_1c = 0.0;
  v_array<float>::push_back(&psVar1->delta,&local_1c);
  return (int)((ulong)((long)(psVar1->support_vec)._end - (long)(psVar1->support_vec)._begin) >> 3)
         + -1;
}

Assistant:

int add(svm_params& params, svm_example* fec)
{
  svm_model* model = params.model;
  model->num_support++;
  model->support_vec.push_back(fec);
  model->alpha.push_back(0.);
  model->delta.push_back(0.);
  // cout<<"After adding "<<model->num_support<<endl;
  return (int)(model->support_vec.size() - 1);
}